

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_optimise_unretained(mpc_parser_t *p,int force)

{
  int iVar1;
  mpc_check_t p_Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined6 uVar6;
  char cVar7;
  int iVar8;
  void *pvVar9;
  code *pcVar10;
  void *pvVar11;
  mpc_parser_t **ppmVar12;
  mpc_parser_t *p_00;
  long lVar13;
  mpc_parser_t *__ptr;
  long lVar14;
  
  if ((force == 0) && (p->retained != '\0')) {
    return;
  }
  cVar7 = p->type;
  if (cVar7 == '\x05') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x0f') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x10') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x19') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x1a') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x11') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x12') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x13') {
    mpc_optimise_unretained((p->data).expect.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x14') {
    mpc_optimise_unretained((p->data).repeat.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x15') {
    mpc_optimise_unretained((p->data).repeat.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x16') {
    mpc_optimise_unretained((p->data).repeat.x,0);
    cVar7 = p->type;
  }
  if (cVar7 == '\x17') {
    for (lVar13 = 0; lVar13 < (p->data).repeat.n; lVar13 = lVar13 + 1) {
      mpc_optimise_unretained(*(mpc_parser_t **)((long)(p->data).lift.x + lVar13 * 8),0);
    }
    cVar7 = p->type;
  }
  if (cVar7 == '\x18') {
    for (lVar13 = 0; lVar13 < (p->data).repeat.n; lVar13 = lVar13 + 1) {
      mpc_optimise_unretained(*(mpc_parser_t **)((long)(p->data).apply_to.d + lVar13 * 8),0);
    }
  }
  do {
    if (p->type == '\x18') {
      iVar1 = (p->data).repeat.n;
      lVar13 = (long)iVar1;
      if (lVar13 != 2) {
LAB_001b31d8:
        pcVar10 = (code *)(p->data).lift.x;
        if (pcVar10 == mpcf_fold_ast) {
          ppmVar12 = (p->data).and.xs;
          __ptr = *ppmVar12;
          if (((__ptr->type == '\x18') && (__ptr->retained == '\0')) &&
             ((code *)(__ptr->data).lift.x == mpcf_fold_ast)) {
            iVar8 = (__ptr->data).repeat.n;
            lVar14 = (long)iVar8;
            (p->data).repeat.n = iVar8 + iVar1 + -1;
            pvVar11 = realloc(ppmVar12,(lVar14 + lVar13) * 8 - 8);
            (p->data).apply_to.d = pvVar11;
            pvVar11 = realloc((p->data).check_with.d,(long)(int)(lVar14 + lVar13) * 8 - 0x10);
            (p->data).check_with.d = pvVar11;
            p_Var2 = (p->data).check.f;
            memmove(p_Var2 + lVar14 * 8,p_Var2 + 8,lVar13 * 8 - 8);
            memmove((p->data).apply_to.d,(__ptr->data).apply_to.d,lVar14 << 3);
            for (lVar13 = 0; lVar13 < (long)(p->data).repeat.n + -1; lVar13 = lVar13 + 1) {
              *(code **)((p->data).check.e + lVar13 * 8) = mpc_ast_delete;
            }
          }
          else {
            pvVar11 = (p->data).apply_to.d;
            __ptr = *(mpc_parser_t **)((long)pvVar11 + lVar13 * 8 + -8);
            pcVar10 = mpcf_fold_ast;
            if (((__ptr->type != '\x18') || (pcVar10 = mpcf_fold_ast, __ptr->retained != '\0')) ||
               (pcVar10 = mpcf_fold_ast, (code *)(__ptr->data).lift.x != mpcf_fold_ast))
            goto LAB_001b3247;
            iVar8 = (__ptr->data).repeat.n;
            lVar14 = iVar8 + lVar13;
            (p->data).repeat.n = iVar8 + iVar1 + -1;
            pvVar11 = realloc(pvVar11,lVar14 * 8 - 8);
            (p->data).apply_to.d = pvVar11;
            pvVar11 = realloc((p->data).check_with.d,(long)(int)lVar14 * 8 - 0x10);
            (p->data).check_with.d = pvVar11;
            memmove((void *)((long)(p->data).apply_to.d + lVar13 * 8 + -8),(__ptr->data).apply_to.d,
                    (long)iVar8 << 3);
            for (lVar13 = 0; lVar13 < (long)(p->data).repeat.n + -1; lVar13 = lVar13 + 1) {
              *(code **)((p->data).check.e + lVar13 * 8) = mpc_ast_delete;
            }
          }
        }
        else {
LAB_001b3247:
          if (iVar1 == 2) goto LAB_001b324d;
LAB_001b3271:
          if (pcVar10 != mpcf_strfold) {
            return;
          }
          ppmVar12 = (p->data).and.xs;
          __ptr = *ppmVar12;
          if (((__ptr->type == '\x18') && (__ptr->retained == '\0')) &&
             ((code *)(__ptr->data).lift.x == mpcf_strfold)) {
            iVar8 = (__ptr->data).repeat.n;
            lVar14 = (long)iVar8;
            (p->data).repeat.n = iVar8 + iVar1 + -1;
            pvVar11 = realloc(ppmVar12,(lVar14 + lVar13) * 8 - 8);
            (p->data).apply_to.d = pvVar11;
            pvVar11 = realloc((p->data).check_with.d,(long)(int)(lVar14 + lVar13) * 8 - 0x10);
            (p->data).check_with.d = pvVar11;
            p_Var2 = (p->data).check.f;
            memmove(p_Var2 + lVar14 * 8,p_Var2 + 8,lVar13 * 8 - 8);
            memmove((p->data).apply_to.d,(__ptr->data).apply_to.d,lVar14 << 3);
            for (lVar13 = 0; lVar13 < (long)(p->data).repeat.n + -1; lVar13 = lVar13 + 1) {
              *(code **)((p->data).check.e + lVar13 * 8) = free;
            }
          }
          else {
            pvVar11 = (p->data).apply_to.d;
            __ptr = *(mpc_parser_t **)((long)pvVar11 + lVar13 * 8 + -8);
            if (__ptr->type != '\x18') {
              return;
            }
            if (__ptr->retained != '\0') {
              return;
            }
            if ((code *)(__ptr->data).lift.x != mpcf_strfold) {
              return;
            }
            iVar8 = (__ptr->data).repeat.n;
            lVar14 = iVar8 + lVar13;
            (p->data).repeat.n = iVar8 + iVar1 + -1;
            pvVar11 = realloc(pvVar11,lVar14 * 8 - 8);
            (p->data).apply_to.d = pvVar11;
            pvVar11 = realloc((p->data).check_with.d,(long)(int)lVar14 * 8 - 0x10);
            (p->data).check_with.d = pvVar11;
            memmove((void *)((long)(p->data).apply_to.d + lVar13 * 8 + -8),(__ptr->data).apply_to.d,
                    (long)iVar8 << 3);
            for (lVar13 = 0; lVar13 < (long)(p->data).repeat.n + -1; lVar13 = lVar13 + 1) {
              *(code **)((p->data).check.e + lVar13 * 8) = free;
            }
          }
        }
        free((__ptr->data).apply_to.d);
        pvVar11 = (__ptr->data).check_with.d;
        goto LAB_001b358c;
      }
      ppmVar12 = (p->data).and.xs;
      p_00 = *ppmVar12;
      if ((p_00->type != '\x01') || (p_00->retained != '\0')) goto LAB_001b31d8;
      pcVar10 = (code *)(p->data).lift.x;
      if (pcVar10 != mpcf_fold_ast) {
LAB_001b324d:
        ppmVar12 = (p->data).and.xs;
        p_00 = *ppmVar12;
        if (((p_00->type != '\x03') || ((p_00->data).lift.lf != mpcf_ctor_str)) ||
           (p_00->retained != '\0')) goto LAB_001b3271;
        if (pcVar10 != mpcf_strfold) {
          return;
        }
      }
      __ptr = ppmVar12[1];
      mpc_delete(p_00);
      free((p->data).apply_to.d);
      free((p->data).check_with.d);
      free(p->name);
      cVar7 = __ptr->retained;
      uVar6 = *(undefined6 *)&__ptr->field_0x32;
      p->type = __ptr->type;
      p->retained = cVar7;
      *(undefined6 *)&p->field_0x32 = uVar6;
      pcVar3 = __ptr->name;
      pcVar4 = (__ptr->data).fail.m;
      pvVar11 = (__ptr->data).lift.x;
      pvVar9 = (__ptr->data).apply_to.d;
      pcVar5 = (__ptr->data).check_with.e;
      (p->data).check.e = (__ptr->data).check.e;
      (p->data).check_with.e = pcVar5;
      (p->data).lift.x = pvVar11;
      (p->data).apply_to.d = pvVar9;
      p->name = pcVar3;
      (p->data).fail.m = pcVar4;
    }
    else {
      if (p->type != '\x17') {
        return;
      }
      ppmVar12 = (p->data).or.xs;
      iVar1 = (p->data).repeat.n;
      __ptr = ppmVar12[(long)iVar1 + -1];
      if ((__ptr->type == '\x17') && (__ptr->retained == '\0')) {
        iVar8 = (__ptr->data).repeat.n;
        lVar13 = (long)iVar8;
        iVar8 = iVar1 + iVar8 + -1;
        (p->data).repeat.n = iVar8;
        pvVar9 = realloc(ppmVar12,(long)iVar8 << 3);
        (p->data).lift.x = pvVar9;
        pvVar9 = (void *)((long)pvVar9 + (long)iVar1 * 8 + -8);
        pvVar11 = (__ptr->data).lift.x;
      }
      else {
        __ptr = *ppmVar12;
        if (__ptr->type != '\x17') {
          return;
        }
        if (__ptr->retained != '\0') {
          return;
        }
        iVar8 = (__ptr->data).repeat.n;
        lVar13 = (long)iVar8;
        iVar8 = iVar1 + iVar8 + -1;
        (p->data).repeat.n = iVar8;
        pvVar9 = realloc(ppmVar12,(long)iVar8 << 3);
        (p->data).lift.x = pvVar9;
        memmove((void *)((long)pvVar9 + lVar13 * 8),(void *)((long)pvVar9 + 8),
                (long)(iVar1 + -1) << 3);
        pvVar11 = (__ptr->data).lift.x;
      }
      memmove(pvVar9,pvVar11,lVar13 << 3);
      pvVar11 = (__ptr->data).lift.x;
LAB_001b358c:
      free(pvVar11);
      free(__ptr->name);
    }
    free(__ptr);
  } while( true );
}

Assistant:

static void mpc_optimise_unretained(mpc_parser_t *p, int force) {

  int i, n, m;
  mpc_parser_t *t;

  if (p->retained && !force) { return; }

  /* Optimise Subexpressions */

  if (p->type == MPC_TYPE_EXPECT)     { mpc_optimise_unretained(p->data.expect.x, 0); }
  if (p->type == MPC_TYPE_APPLY)      { mpc_optimise_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO)   { mpc_optimise_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_CHECK)      { mpc_optimise_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { mpc_optimise_unretained(p->data.check_with.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)    { mpc_optimise_unretained(p->data.predict.x, 0); }
  if (p->type == MPC_TYPE_NOT)        { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE)      { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MANY)       { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1)      { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT)      { mpc_optimise_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    for(i = 0; i < p->data.or.n; i++) {
      mpc_optimise_unretained(p->data.or.xs[i], 0);
    }
  }

  if (p->type == MPC_TYPE_AND) {
    for(i = 0; i < p->data.and.n; i++) {
      mpc_optimise_unretained(p->data.and.xs[i], 0);
    }
  }

  /* Perform optimisations */

  while (1) {

    /* Merge rhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[p->data.or.n-1]->type == MPC_TYPE_OR
    && !p->data.or.xs[p->data.or.n-1]->retained) {
      t = p->data.or.xs[p->data.or.n-1];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + n - 1, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Merge lhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[0]->type == MPC_TYPE_OR
    && !p->data.or.xs[0]->retained) {
      t = p->data.or.xs[0];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + m, p->data.or.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.or.xs, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Remove ast `pass` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_PASS
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge ast lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge ast rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Remove re `lift` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_LIFT
    &&  p->data.and.xs[0]->data.lift.lf == mpcf_ctor_str
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge re lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge re rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    return;

  }

}